

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.h
# Opt level: O0

void __thiscall cfd::core::TxOut::TxOut(TxOut *this,TxOut *param_1)

{
  TxOut *param_1_local;
  TxOut *this_local;
  
  AbstractTxOut::AbstractTxOut(&this->super_AbstractTxOut,&param_1->super_AbstractTxOut);
  (this->super_AbstractTxOut)._vptr_AbstractTxOut = (_func_int **)&PTR__TxOut_009f80a8;
  return;
}

Assistant:

class CFD_CORE_EXPORT TxOut : public AbstractTxOut {
 public:
  /**
   * @brief constructor
   */
  TxOut();
  /**
   * @brief constructor
   * @param[in] value             amount value.
   * @param[in] locking_script    locking script.
   */
  TxOut(const Amount& value, const Script& locking_script);
  /**
   * @brief constructor
   * @param[in] value             amount value.
   * @param[in] address           out address.
   */
  TxOut(const Amount& value, const Address& address);
  /**
   * @brief destructor
   */
  virtual ~TxOut() {
    // do nothing
  }
}